

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O2

int sinc_multichan_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  int iVar1;
  SINC_FILTER *filter;
  float *pfVar2;
  coeff_t *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  increment_t iVar7;
  increment_t iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_b0;
  double local_a0;
  
  filter = (SINC_FILTER *)psrc->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    iVar6 = 5;
  }
  else {
    iVar5 = filter->channels;
    filter->in_count = data->input_frames * (long)iVar5;
    filter->out_count = data->output_frames * (long)iVar5;
    filter->out_gen = 0;
    filter->in_used = 0;
    local_a0 = psrc->last_ratio;
    iVar6 = 0x16;
    if ((0.00390625 <= local_a0) && (local_a0 <= 256.0)) {
      dVar22 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
      dVar20 = local_a0;
      if (data->src_ratio <= local_a0) {
        dVar20 = data->src_ratio;
      }
      lVar11 = lrint((double)(-(ulong)(dVar20 < 1.0) & (ulong)(dVar22 / dVar20) |
                             ~-(ulong)(dVar20 < 1.0) & (ulong)dVar22));
      iVar5 = ((int)lVar11 + 1) * iVar5;
      dVar20 = psrc->last_position;
      local_b0 = fmod_one(dVar20);
      iVar6 = filter->b_current;
      iVar1 = filter->channels;
      lVar11 = lrint(dVar20 - local_b0);
      lVar16 = (long)filter->b_len;
      lVar11 = (lVar11 * iVar1 + (long)iVar6) % lVar16;
      filter->b_current = (int)lVar11;
      dVar20 = 1.0 / local_a0;
      while (iVar6 = (int)lVar11, filter->out_gen < filter->out_count) {
        if (((filter->b_end - iVar6) + (int)lVar16) % (int)lVar16 <= iVar5) {
          iVar6 = prepare_data(filter,data,iVar5);
          psrc->error = iVar6;
          if (iVar6 != 0) {
            return iVar6;
          }
          iVar6 = filter->b_current;
          if (((filter->b_end - iVar6) + filter->b_len) % filter->b_len <= iVar5) break;
        }
        if ((-1 < filter->b_real_end) &&
           ((double)filter->b_real_end <= (double)iVar6 + local_b0 + dVar20 + 1e-20)) break;
        if (0 < filter->out_count) {
          dVar22 = psrc->last_ratio;
          if (1e-10 < ABS(dVar22 - data->src_ratio)) {
            local_a0 = ((data->src_ratio - dVar22) * (double)filter->out_gen) /
                       (double)filter->out_count + dVar22;
          }
        }
        dVar22 = local_a0;
        if (1.0 <= local_a0) {
          dVar22 = 1.0;
        }
        dVar22 = dVar22 * (double)filter->index_inc;
        iVar7 = double_to_fp(dVar22);
        iVar8 = double_to_fp(local_b0 * dVar22);
        iVar6 = filter->index_inc;
        iVar1 = filter->channels;
        uVar18 = (ulong)iVar1;
        pfVar2 = data->data_out;
        lVar11 = filter->out_gen;
        iVar9 = filter->coeff_half_len * 0x1000;
        iVar10 = (iVar9 - iVar8) / iVar7;
        uVar15 = iVar10 * iVar7 + iVar8;
        iVar19 = filter->b_current;
        iVar10 = iVar19 - iVar10 * iVar1;
        memset(filter->left_calc,0,uVar18 << 3);
        pcVar3 = filter->coeffs;
        do {
          dVar21 = (double)(pcVar3[(long)((int)uVar15 >> 0xc) + 1] - pcVar3[(int)uVar15 >> 0xc]) *
                   (double)(uVar15 & 0xfff) * 0.000244140625 + (double)pcVar3[(int)uVar15 >> 0xc];
          iVar14 = iVar1;
          do {
            iVar13 = iVar14;
            iVar12 = iVar14;
            switch(iVar14 % 8) {
            case 1:
              break;
            default:
              iVar12 = iVar14 + -1;
              filter->left_calc[(long)iVar14 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar14 + iVar10 + -1) * 4 + -0x58) * dVar21 +
                   filter->left_calc[(long)iVar14 + -1];
            case 7:
              iVar13 = iVar12 + -1;
              filter->left_calc[(long)iVar12 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar12 + iVar10 + -1) * 4 + -0x58) * dVar21 +
                   filter->left_calc[(long)iVar12 + -1];
            case 6:
              iVar14 = iVar13 + -1;
              filter->left_calc[(long)iVar13 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar13 + iVar10 + -1) * 4 + -0x58) * dVar21 +
                   filter->left_calc[(long)iVar13 + -1];
            case 5:
              iVar13 = iVar14 + -1;
              filter->left_calc[(long)iVar14 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar14 + iVar10 + -1) * 4 + -0x58) * dVar21 +
                   filter->left_calc[(long)iVar14 + -1];
            case 4:
              iVar14 = iVar13 + -1;
              filter->left_calc[(long)iVar13 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar13 + iVar10 + -1) * 4 + -0x58) * dVar21 +
                   filter->left_calc[(long)iVar13 + -1];
            case 3:
              iVar13 = iVar14 + -1;
              filter->left_calc[(long)iVar14 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar14 + iVar10 + -1) * 4 + -0x58) * dVar21 +
                   filter->left_calc[(long)iVar14 + -1];
            case 2:
              iVar14 = iVar13 + -1;
              filter->left_calc[(long)iVar13 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar13 + iVar10 + -1) * 4 + -0x58) * dVar21 +
                   filter->left_calc[(long)iVar13 + -1];
            }
            filter->left_calc[(long)iVar14 + -1] =
                 (double)*(float *)((long)filter[1].left_calc +
                                   (long)(iVar14 + iVar10 + -1) * 4 + -0x58) * dVar21 +
                 filter->left_calc[(long)iVar14 + -1];
            bVar4 = 1 < iVar14;
            iVar14 = iVar14 + -1;
          } while (bVar4);
          iVar10 = iVar10 + iVar1;
          uVar15 = uVar15 - iVar7;
        } while (-1 < (int)uVar15);
        dVar22 = dVar22 / (double)iVar6;
        iVar6 = (iVar9 - (iVar7 - iVar8)) / iVar7;
        iVar19 = (iVar6 + 1) * iVar1 + iVar19;
        memset(filter->right_calc,0,uVar18 << 3);
        uVar15 = iVar6 * iVar7 + (iVar7 - iVar8);
        do {
          dVar21 = (double)(pcVar3[(long)((int)uVar15 >> 0xc) + 1] - pcVar3[(int)uVar15 >> 0xc]) *
                   (double)(uVar15 & 0xfff) * 0.000244140625 + (double)pcVar3[(int)uVar15 >> 0xc];
          iVar6 = iVar1;
          do {
            iVar9 = iVar6;
            iVar10 = iVar6;
            switch(iVar6 % 8) {
            case 1:
              break;
            default:
              iVar10 = iVar6 + -1;
              filter->right_calc[(long)iVar6 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar6 + iVar19 + -1) * 4 + -0x58) * dVar21 +
                   filter->right_calc[(long)iVar6 + -1];
            case 7:
              iVar9 = iVar10 + -1;
              filter->right_calc[(long)iVar10 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar10 + iVar19 + -1) * 4 + -0x58) * dVar21 +
                   filter->right_calc[(long)iVar10 + -1];
            case 6:
              iVar6 = iVar9 + -1;
              filter->right_calc[(long)iVar9 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar9 + iVar19 + -1) * 4 + -0x58) * dVar21 +
                   filter->right_calc[(long)iVar9 + -1];
            case 5:
              iVar9 = iVar6 + -1;
              filter->right_calc[(long)iVar6 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar6 + iVar19 + -1) * 4 + -0x58) * dVar21 +
                   filter->right_calc[(long)iVar6 + -1];
            case 4:
              iVar6 = iVar9 + -1;
              filter->right_calc[(long)iVar9 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar9 + iVar19 + -1) * 4 + -0x58) * dVar21 +
                   filter->right_calc[(long)iVar9 + -1];
            case 3:
              iVar9 = iVar6 + -1;
              filter->right_calc[(long)iVar6 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar6 + iVar19 + -1) * 4 + -0x58) * dVar21 +
                   filter->right_calc[(long)iVar6 + -1];
            case 2:
              iVar6 = iVar9 + -1;
              filter->right_calc[(long)iVar9 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(iVar9 + iVar19 + -1) * 4 + -0x58) * dVar21 +
                   filter->right_calc[(long)iVar9 + -1];
            }
            filter->right_calc[(long)iVar6 + -1] =
                 (double)*(float *)((long)filter[1].left_calc +
                                   (long)(iVar6 + iVar19 + -1) * 4 + -0x58) * dVar21 +
                 filter->right_calc[(long)iVar6 + -1];
            bVar4 = 1 < iVar6;
            iVar6 = iVar6 + -1;
          } while (bVar4);
          iVar19 = iVar19 - iVar1;
          uVar17 = uVar15 - iVar7;
          bVar4 = iVar7 <= (int)uVar15;
          uVar15 = uVar17;
        } while (uVar17 != 0 && bVar4);
        do {
          iVar6 = (int)uVar18;
          switch((int)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) % 8)) {
          case 1:
            break;
          default:
            lVar16 = (long)iVar6;
            iVar6 = iVar6 + -1;
            pfVar2[lVar11 + lVar16 + -1] =
                 (float)((filter->left_calc[lVar16 + -1] + filter->right_calc[lVar16 + -1]) * dVar22
                        );
          case 7:
            lVar16 = (long)iVar6;
            iVar6 = iVar6 + -1;
            pfVar2[lVar11 + lVar16 + -1] =
                 (float)((filter->left_calc[lVar16 + -1] + filter->right_calc[lVar16 + -1]) * dVar22
                        );
          case 6:
            lVar16 = (long)iVar6;
            iVar6 = iVar6 + -1;
            pfVar2[lVar11 + lVar16 + -1] =
                 (float)((filter->left_calc[lVar16 + -1] + filter->right_calc[lVar16 + -1]) * dVar22
                        );
          case 5:
            lVar16 = (long)iVar6;
            iVar6 = iVar6 + -1;
            pfVar2[lVar11 + lVar16 + -1] =
                 (float)((filter->left_calc[lVar16 + -1] + filter->right_calc[lVar16 + -1]) * dVar22
                        );
          case 4:
            lVar16 = (long)iVar6;
            iVar6 = iVar6 + -1;
            pfVar2[lVar11 + lVar16 + -1] =
                 (float)((filter->left_calc[lVar16 + -1] + filter->right_calc[lVar16 + -1]) * dVar22
                        );
          case 3:
            lVar16 = (long)iVar6;
            iVar6 = iVar6 + -1;
            pfVar2[lVar11 + lVar16 + -1] =
                 (float)((filter->left_calc[lVar16 + -1] + filter->right_calc[lVar16 + -1]) * dVar22
                        );
          case 2:
            lVar16 = (long)iVar6;
            iVar6 = iVar6 + -1;
            pfVar2[lVar11 + lVar16 + -1] =
                 (float)((filter->left_calc[lVar16 + -1] + filter->right_calc[lVar16 + -1]) * dVar22
                        );
          }
          lVar16 = (long)iVar6;
          uVar18 = (ulong)(iVar6 - 1);
          pfVar2[lVar11 + lVar16 + -1] =
               (float)((filter->left_calc[lVar16 + -1] + filter->right_calc[lVar16 + -1]) * dVar22);
        } while (1 < iVar6);
        filter->out_gen = lVar11 + psrc->channels;
        dVar22 = local_b0 + 1.0 / local_a0;
        local_b0 = fmod_one(dVar22);
        iVar6 = filter->b_current;
        iVar1 = filter->channels;
        lVar11 = lrint(dVar22 - local_b0);
        lVar16 = (long)filter->b_len;
        lVar11 = (lVar11 * iVar1 + (long)iVar6) % lVar16;
        filter->b_current = (int)lVar11;
      }
      psrc->last_position = local_b0;
      psrc->last_ratio = local_a0;
      iVar6 = filter->channels;
      data->input_frames_used = filter->in_used / (long)iVar6;
      data->output_frames_gen = filter->out_gen / (long)iVar6;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int
sinc_multichan_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) psrc->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * filter->channels ;
	filter->out_count = data->output_frames * filter->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (psrc->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (psrc->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = filter->channels * (lrint (count) + 1) ;

	input_index = psrc->last_position ;
	float_increment = filter->index_inc ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + filter->channels * lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((psrc->error = prepare_data (filter, data, half_filter_chan_len)) != 0)
				return psrc->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = psrc->last_ratio + filter->out_gen * (data->src_ratio - psrc->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_multi (filter, increment, start_filter_index, filter->channels, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += psrc->channels ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + filter->channels * lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	psrc->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / filter->channels ;
	data->output_frames_gen = filter->out_gen / filter->channels ;

	return SRC_ERR_NO_ERROR ;
}